

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  basic_string_view<wchar_t> sep;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar1;
  undefined8 *in_RSI;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_RDI;
  add_thousands_sep<wchar_t> in_stack_00000010;
  basic_string_view<wchar_t> s;
  add_thousands_sep<wchar_t> local_48;
  undefined8 local_30;
  basic_string_view<wchar_t> local_20;
  
  basic_string_view<wchar_t>::basic_string_view
            (&local_20,
             (wchar_t *)
             &((in_RDI.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
              field_0x8,1);
  local_30 = *in_RSI;
  sep.size_ = local_20.size_;
  sep.data_ = local_20.data_;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_48,sep);
  bVar1 = internal::
          format_decimal<wchar_t,unsigned_int,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (in_RDI,(uint)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_00000010);
  *in_RSI = bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }